

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-bitmap.h
# Opt level: O2

int bitmap_set_bit_p(bitmap_t bm,size_t nb)

{
  ulong uVar1;
  bitmap_el_t *pbVar2;
  
  bitmap_expand(bm,nb + 1);
  pbVar2 = VARR_bitmap_el_taddr(bm);
  uVar1 = pbVar2[nb >> 6];
  pbVar2[nb >> 6] = uVar1 | 1L << (nb & 0x3f);
  return (int)((uVar1 >> (nb & 0x3f) & 1) == 0);
}

Assistant:

static inline int bitmap_set_bit_p (bitmap_t bm, size_t nb) {
  size_t nw, sh;
  bitmap_el_t *addr;
  int res;

  bitmap_expand (bm, nb + 1);
  addr = VARR_ADDR (bitmap_el_t, bm);
  nw = nb / BITMAP_WORD_BITS;
  sh = nb % BITMAP_WORD_BITS;
  res = ((addr[nw] >> sh) & 1) == 0;
  addr[nw] |= (bitmap_el_t) 1 << sh;
  return res;
}